

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O1

void __thiscall iqxmlrpc::Server::work(Server *this)

{
  Impl *pIVar1;
  Acceptor *pAVar2;
  Reactor_base *pRVar3;
  int iVar4;
  Acceptor *this_00;
  
  pIVar1 = this->impl;
  if ((pIVar1->acceptor)._M_ptr == (Acceptor *)0x0) {
    this_00 = (Acceptor *)operator_new(0x48);
    iqnet::Acceptor::Acceptor
              (this_00,&pIVar1->bind_addr,(pIVar1->conn_factory)._M_ptr,(pIVar1->reactor)._M_ptr);
    pAVar2 = (pIVar1->acceptor)._M_ptr;
    if (pAVar2 != this_00) {
      if (pAVar2 != (Acceptor *)0x0) {
        (*(pAVar2->super_Event_handler)._vptr_Event_handler[1])();
      }
      (pIVar1->acceptor)._M_ptr = this_00;
    }
    iqnet::Acceptor::set_firewall((this->impl->acceptor)._M_ptr,this->impl->firewall);
  }
  do {
    if (this->impl->exit_flag != false) break;
    pRVar3 = (this->impl->reactor)._M_ptr;
    iVar4 = (*pRVar3->_vptr_Reactor_base[6])(pRVar3,0xffffffff);
  } while ((char)iVar4 != '\0');
  pIVar1 = this->impl;
  pAVar2 = (pIVar1->acceptor)._M_ptr;
  if (pAVar2 != (Acceptor *)0x0) {
    (*(pAVar2->super_Event_handler)._vptr_Event_handler[1])();
    (pIVar1->acceptor)._M_ptr = (Acceptor *)0x0;
  }
  this->impl->exit_flag = false;
  return;
}

Assistant:

void Server::work()
{
  if( !impl->acceptor.get() )
  {
    impl->acceptor.reset(new iqnet::Acceptor( impl->bind_addr, get_conn_factory(), get_reactor()));
    impl->acceptor->set_firewall( impl->firewall );
  }

  for(bool have_handlers = true; have_handlers;)
  {
    if (impl->exit_flag)
      break;

    have_handlers = get_reactor()->handle_events();
  }

  impl->acceptor.reset(0);
  impl->exit_flag = false;
}